

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::NumberFormatPartsBuilder::GetPartTypeString
          (NumberFormatPartsBuilder *this,UNumberFormatFields field)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  undefined4 *puVar4;
  NumberFormatPartsBuilder *local_40;
  JavascriptLibrary *library;
  UNumberFormatFields field_local;
  NumberFormatPartsBuilder *this_local;
  
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->sc);
  this_01 = ScriptContext::GetLibrary(this_00);
  if (field == ~UNUM_INTEGER_FIELD) {
    this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlLiteralPartString(this_01);
  }
  else {
    switch(field) {
    case UNUM_INTEGER_FIELD:
      BVar3 = JavascriptNumber::IsNan(this->num);
      if (BVar3 == 0) {
        bVar2 = NumberUtilities::IsFinite(this->num);
        if (bVar2) {
          this_local = (NumberFormatPartsBuilder *)
                       JavascriptLibrary::GetIntlIntegerPartString(this_01);
        }
        else {
          this_local = (NumberFormatPartsBuilder *)
                       JavascriptLibrary::GetIntlInfinityPartString(this_01);
        }
      }
      else {
        this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlNanPartString(this_01);
      }
      break;
    case UNUM_FRACTION_FIELD:
      this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlFractionPartString(this_01)
      ;
      break;
    case UNUM_DECIMAL_SEPARATOR_FIELD:
      this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlDecimalPartString(this_01);
      break;
    case UNUM_EXPONENT_SYMBOL_FIELD:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x8f5,"(false)","Unexpected exponent symbol field");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    case UNUM_EXPONENT_SIGN_FIELD:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x8f6,"(false)","Unexpected exponent sign field");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    case UNUM_EXPONENT_FIELD:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x8f7,"(false)","Unexpected exponent field");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    case UNUM_GROUPING_SEPARATOR_FIELD:
      this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlGroupPartString(this_01);
      break;
    case UNUM_CURRENCY_FIELD:
      this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlCurrencyPartString(this_01)
      ;
      break;
    case UNUM_PERCENT_FIELD:
      this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlPercentPartString(this_01);
      break;
    case UNUM_PERMILL_FIELD:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x8fe,"(false)","Unexpected permill field");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    case UNUM_SIGN_FIELD:
      if (0.0 < this->num || this->num == 0.0) {
        local_40 = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlPlusSignPartString(this_01)
        ;
      }
      else {
        local_40 = (NumberFormatPartsBuilder *)
                   JavascriptLibrary::GetIntlMinusSignPartString(this_01);
      }
      this_local = local_40;
      break;
    default:
      this_local = (NumberFormatPartsBuilder *)JavascriptLibrary::GetIntlUnknownPartString(this_01);
    }
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString *GetPartTypeString(UNumberFormatFields field)
        {
            JavascriptLibrary *library = sc->GetLibrary();

            // this is outside the switch because MSVC doesn't like that UnsetField is not a valid enum value
            if (field == UnsetField)
            {
                return library->GetIntlLiteralPartString();
            }

            switch (field)
            {
            case UNUM_INTEGER_FIELD:
            {
                if (JavascriptNumber::IsNan(num))
                {
                    return library->GetIntlNanPartString();
                }
                else if (!NumberUtilities::IsFinite(num))
                {
                    return library->GetIntlInfinityPartString();
                }
                else
                {
                    return library->GetIntlIntegerPartString();
                }
            }
            case UNUM_FRACTION_FIELD: return library->GetIntlFractionPartString();
            case UNUM_DECIMAL_SEPARATOR_FIELD: return library->GetIntlDecimalPartString();

            // The following three should only show up if UNUM_SCIENTIFIC is used, which Intl.NumberFormat doesn't currently use
            case UNUM_EXPONENT_SYMBOL_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent symbol field");
            case UNUM_EXPONENT_SIGN_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent sign field");
            case UNUM_EXPONENT_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent field");

            case UNUM_GROUPING_SEPARATOR_FIELD: return library->GetIntlGroupPartString();
            case UNUM_CURRENCY_FIELD: return library->GetIntlCurrencyPartString();
            case UNUM_PERCENT_FIELD: return library->GetIntlPercentPartString();

            // TODO(jahorto): Determine if this would ever be returned and what it would map to
            case UNUM_PERMILL_FIELD: AssertOrFailFastMsg(false, "Unexpected permill field");

            case UNUM_SIGN_FIELD: return num < 0 ? library->GetIntlMinusSignPartString() : library->GetIntlPlusSignPartString();

            // At the ECMA-402 TC39 call for May 2017, it was decided that we should treat unmapped parts as type: "unknown"
            default: return library->GetIntlUnknownPartString();
            }
        }